

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<int>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  long *plVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  void *__src;
  size_t sVar8;
  bool bVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  string result_str;
  string reference_str;
  int reference [8];
  int result [8];
  stringstream ss;
  long *local_2a0 [2];
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  long *local_260;
  long local_250 [2];
  AttributeFormatTest *local_240;
  int local_238 [8];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  int local_1f8 [4];
  int iStack_1e8;
  int local_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int local_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c8;
  undefined8 local_1c4;
  int local_1bc;
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  undefined1 local_1a8 [104];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar12 + 0x1680))(this->m_po);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  local_240 = this;
  (**(code **)(lVar12 + 0xd8))(this->m_vao);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar12 + 0x30))(0);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar12 + 0x538))(0,0,2);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar12 + 0x638))();
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  __src = (void *)(**(code **)(lVar12 + 0xcf8))(0x8c8e,35000);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uVar4 = size * 2;
  uVar14 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    memcpy(&local_218,__src,uVar14 * 4);
  }
  (**(code **)(lVar12 + 0x1670))(0x8c8e);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar16 = 0x3fb00000;
  }
  else {
    uVar16 = 0x3ff00000;
  }
  local_1f8[0] = 0;
  dVar2 = (double)((ulong)uVar16 << 0x20);
  dVar3 = (double)((ulong)uVar16 << 0x20);
  local_1f8[1] = (int)(double)((ulong)uVar16 << 0x20);
  local_1f8[2] = (int)((double)((ulong)uVar16 << 0x20) + (double)((ulong)uVar16 << 0x20));
  local_1f8[3] = (int)(dVar2 * 3.0);
  iStack_1e8 = (int)(dVar3 * 4.0);
  local_1e4 = (int)(dVar2 * 5.0);
  iStack_1e0 = (int)(dVar3 * 6.0);
  iStack_1dc = (int)(dVar2 * 7.0);
  iStack_1d8 = (int)(dVar3 * 8.0);
  local_1d4 = (int)(dVar2 * 9.0);
  iStack_1d0 = (int)(dVar3 * 10.0);
  iStack_1cc = (int)(dVar2 * 11.0);
  iStack_1c8 = (int)(dVar3 * 12.0);
  local_1c4 = CONCAT44((int)(dVar3 * 14.0),(int)(dVar2 * 13.0));
  local_1bc = (int)((double)((ulong)uVar16 << 0x20) * 15.0);
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[6] = 0;
  local_238[7] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  lVar12 = 0;
  bVar15 = true;
  do {
    bVar9 = bVar15;
    if (0 < size) {
      iVar6 = size * (int)lVar12 * 2;
      lVar10 = lVar12 * ((ulong)(uint)size << 0x20);
      iVar11 = ((int)lVar12 * 2 + 1) * size;
      uVar13 = (ulong)(uint)size;
      do {
        *(int *)((long)local_238 + (lVar10 >> 0x1e)) = local_1f8[iVar11] + local_1f8[iVar6];
        lVar10 = lVar10 + 0x100000000;
        iVar11 = iVar11 + 1;
        iVar6 = iVar6 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    lVar12 = 1;
    bVar15 = false;
  } while (bVar9);
  bVar15 = true;
  if (0 < (int)uVar4) {
    if (local_238[0] == (int)local_218) {
      uVar13 = 0;
      do {
        if (uVar14 - 1 == uVar13) {
          return true;
        }
        lVar10 = uVar13 + 1;
        uVar1 = uVar13 + 1;
        lVar12 = uVar13 * 4;
        uVar13 = uVar1;
      } while (local_238[lVar10] == *(int *)((long)&local_218 + lVar12 + 4));
      bVar15 = uVar14 <= uVar1;
    }
    else {
      bVar15 = false;
    }
    local_280[0] = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"[ ","");
    uVar13 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::operator<<(local_1a8,local_238[uVar13]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_280,(ulong)local_2a0[0]);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0],local_290[0] + 1);
      }
      std::__cxx11::string::append((char *)local_280);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"[ ","");
    uVar13 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::operator<<(local_1a8,*(int *)((long)&local_218 + uVar13 * 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_260);
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
      std::__cxx11::string::append((char *)local_2a0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    local_1b8 = (undefined1  [8])((local_240->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Result vector is equal to ",0x1a);
    plVar5 = local_2a0[0];
    iVar6 = (int)(ostringstream *)&local_1b0;
    if (local_2a0[0] == (long *)0x0) {
      std::ios::clear(iVar6 + (int)local_1b0[-3]);
    }
    else {
      sVar8 = strlen((char *)local_2a0[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar5,sVar8)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", but ",6);
    plVar5 = local_280[0];
    if (local_280[0] == (long *)0x0) {
      std::ios::clear(iVar6 + (int)local_1b0[-3]);
    }
    else {
      sVar8 = strlen((char *)local_280[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar5,sVar8)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0],local_290[0] + 1);
    }
    if (local_280[0] != local_270) {
      operator_delete(local_280[0],local_270[0] + 1);
    }
  }
  return bVar15;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}